

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

bool __thiscall
caffe::TanHParameter::MergePartialFromCodedStream(TanHParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  uint32 uVar5;
  undefined8 in_RAX;
  UnknownFieldSet *pUVar6;
  uint tag;
  ulong uVar7;
  undefined8 uStack_38;
  int value;
  
  uStack_38 = in_RAX;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_004a9466;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_004a9466:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar7 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar5 | uVar7;
    }
    tag = (uint)uVar7;
    if (((uVar7 & 0x100000000) == 0) || ((char)uVar7 != '\b' || (tag & 0xfffffff8) != 8)) {
      bVar3 = (tag & 7) == 4 || tag == 0;
      if (bVar3) {
        return bVar3;
      }
      pUVar6 = mutable_unknown_fields(this);
      bVar4 = google::protobuf::internal::WireFormat::SkipField(input,tag,pUVar6);
      if (!bVar4) {
        return bVar3;
      }
    }
    else {
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (input,&value);
      if (!bVar3) {
        return false;
      }
      if ((uint)value < 3) {
        set_engine(this,value);
      }
      else {
        pUVar6 = mutable_unknown_fields(this);
        google::protobuf::UnknownFieldSet::AddVarint(pUVar6,1,(long)value);
      }
    }
  } while( true );
}

Assistant:

bool TanHParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.TanHParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .caffe.TanHParameter.Engine engine = 1 [default = DEFAULT];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::TanHParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::TanHParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.TanHParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.TanHParameter)
  return false;
#undef DO_
}